

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect,char aff)

{
  sqlite3 *db;
  Expr *pExpr;
  char cVar1;
  ushort uVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  CollSeq *pCVar6;
  long lVar7;
  ExprList_item *pEVar8;
  Column *pCol;
  ulong uVar9;
  ulong uVar10;
  NameContext sNC;
  NameContext local_68;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    local_68.nRef = 0;
    local_68.nNcErr = 0;
    local_68.ncFlags = 0;
    local_68._44_4_ = 0;
    local_68.uNC.pEList = (ExprList *)0x0;
    local_68.pNext = (NameContext *)0x0;
    local_68.pParse = (Parse *)0x0;
    local_68.pWinSelect = (Select *)0x0;
    local_68.pSrcList = pSelect->pSrc;
    if (0 < pTab->nCol) {
      pEVar8 = pSelect->pEList->a;
      pCol = pTab->aCol;
      lVar7 = 0;
      do {
        pTab->tabFlags = pTab->tabFlags | pCol->colFlags & 0x62;
        pExpr = pEVar8->pExpr;
        __s = columnTypeImpl(&local_68,pExpr);
        cVar1 = sqlite3ExprAffinity(pExpr);
        pCol->affinity = cVar1;
        if (__s != (char *)0x0) {
          sVar3 = strlen(__s);
          pcVar5 = pCol->zCnName;
          if (pcVar5 == (char *)0x0) {
            uVar9 = 0;
          }
          else {
            sVar4 = strlen(pcVar5);
            uVar9 = (ulong)((uint)sVar4 & 0x3fffffff);
          }
          uVar10 = (ulong)((uint)sVar3 & 0x3fffffff);
          pcVar5 = (char *)sqlite3DbReallocOrFree(db,pcVar5,uVar10 + uVar9 + 2);
          pCol->zCnName = pcVar5;
          if (pcVar5 == (char *)0x0) {
            uVar2 = pCol->colFlags & 0xfdfb;
          }
          else {
            memcpy(pcVar5 + uVar9 + 1,__s,uVar10 + 1);
            uVar2 = pCol->colFlags | 4;
          }
          pCol->colFlags = uVar2;
          cVar1 = pCol->affinity;
        }
        if (cVar1 < 'A') {
          pCol->affinity = aff;
        }
        pCVar6 = sqlite3ExprCollSeq(pParse,pExpr);
        if (pCVar6 != (CollSeq *)0x0) {
          sqlite3ColumnSetColl(db,pCol,pCVar6->zName);
        }
        lVar7 = lVar7 + 1;
        pCol = pCol + 1;
        pEVar8 = pEVar8 + 1;
      } while (lVar7 < pTab->nCol);
    }
    pTab->szTabRow = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect,      /* SELECT used to determine types and collations */
  char aff              /* Default affinity for columns */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    i64 n, m;
    pTab->tabFlags |= (pCol->colFlags & COLFLAG_NOINSERT);
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0);
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType ){
      m = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zCnName);
      pCol->zCnName = sqlite3DbReallocOrFree(db, pCol->zCnName, n+m+2);
      if( pCol->zCnName ){
        memcpy(&pCol->zCnName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }else{
        testcase( pCol->colFlags & COLFLAG_HASTYPE );
        pCol->colFlags &= ~(COLFLAG_HASTYPE|COLFLAG_HASCOLL);
      }
    }
    if( pCol->affinity<=SQLITE_AFF_NONE ) pCol->affinity = aff;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl ){
      assert( pTab->pIndex==0 );
      sqlite3ColumnSetColl(db, pCol, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}